

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

void __thiscall re2::Compiler::AddRuneRangeUTF8(Compiler *this,Rune lo,Rune hi,bool foldcase)

{
  byte bVar1;
  PatchList PVar2;
  Frag FVar3;
  bool bVar4;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  uint8 uhi [4];
  uint8 ulo [4];
  undefined4 local_44;
  byte local_40 [8];
  Rune local_38;
  uint local_34;
  
  if (hi < lo) {
    return;
  }
  local_44 = (uint)foldcase;
LAB_00118674:
  if ((lo == 0x80 && hi == 0x10ffff) && (this->reversed_ == false)) {
    Add_80_10ffff(this);
    return;
  }
  iVar5 = 5;
  do {
    uVar9 = ~(-2 << ((byte)iVar5 & 0x1f));
    if (iVar5 == 5) {
      uVar9 = 0x7f;
    }
    bVar4 = SUB41(local_44,0);
    if ((int)uVar9 < hi && lo <= (int)uVar9) {
      AddRuneRangeUTF8(this,lo,uVar9,bVar4);
      lo = uVar9 + 1;
      goto LAB_0011870f;
    }
    iVar5 = iVar5 + 5;
  } while (iVar5 != 0x14);
  if (hi < 0x80) {
    FVar3 = ByteRange(this,lo & 0xff,hi & 0xff,bVar4);
    PVar2 = PatchList::Append(this->inst_,(this->rune_range_).end.p,FVar3.end.p);
    (this->rune_range_).end.p = PVar2.p;
    AddSuffix(this,FVar3.begin);
    return;
  }
  iVar5 = 6;
  do {
    uVar9 = -1 << ((byte)iVar5 & 0x1f);
    uVar10 = uVar9 & hi;
    if ((lo & uVar9) != uVar10) {
      if ((lo & ~uVar9) != 0) {
        uVar9 = ~uVar9 | lo;
        AddRuneRangeUTF8(this,lo,uVar9,bVar4);
        lo = uVar9 + 1;
        goto LAB_0011870f;
      }
      if ((uVar9 | hi) != 0xffffffff) break;
    }
    iVar5 = iVar5 + 6;
    if (iVar5 == 0x18) {
      local_38 = hi;
      local_34 = lo;
      uVar9 = runetochar((char *)(local_40 + 4),(Rune *)&local_34);
      uVar10 = runetochar((char *)local_40,&local_38);
      if (uVar9 != uVar10) {
        __assert_fail("(n) == (m)",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc"
                      ,0x2f2,"void re2::Compiler::AddRuneRangeUTF8(Rune, Rune, bool)");
      }
      if (this->reversed_ == true) {
        if (0 < (int)uVar9) {
          uVar7 = 0;
          iVar5 = 0;
          goto LAB_0011879c;
        }
      }
      else if (0 < (int)uVar9) {
        uVar7 = (ulong)(uVar9 - 1);
        lVar8 = 0;
        iVar5 = 0;
        lVar11 = uVar7 + 1;
        goto LAB_0011880c;
      }
      iVar5 = 0;
      goto LAB_0011886c;
    }
  } while( true );
  AddRuneRangeUTF8(this,lo,uVar10 - 1,bVar4);
  lo = uVar10;
LAB_0011870f:
  if (hi < lo) {
    return;
  }
  goto LAB_00118674;
LAB_0011880c:
  do {
    if (lVar8 == 0) {
      bVar6 = local_40[uVar7 + 4];
      bVar1 = local_40[uVar7];
LAB_0011884d:
      iVar5 = CachedRuneByteSuffix(this,bVar6,bVar1,false,iVar5);
    }
    else {
      bVar6 = local_40[lVar11 + 3];
      bVar1 = local_40[lVar11 + -1];
      if (lVar11 != 1 && bVar6 < bVar1) goto LAB_0011884d;
      iVar5 = UncachedRuneByteSuffix(this,bVar6,bVar1,false,iVar5);
    }
    lVar8 = lVar8 + 1;
    lVar12 = lVar11 + -1;
    bVar4 = 0 < lVar11;
    lVar11 = lVar12;
  } while (lVar12 != 0 && bVar4);
  goto LAB_0011886c;
LAB_0011879c:
  do {
    bVar6 = local_40[4];
    bVar1 = local_40[0];
    if (uVar7 == 0) {
LAB_001187de:
      iVar5 = CachedRuneByteSuffix(this,bVar6,bVar1,false,iVar5);
    }
    else {
      bVar6 = local_40[uVar7 + 4];
      bVar1 = bVar6;
      if (uVar9 - 1 != uVar7 && bVar6 == local_40[uVar7]) goto LAB_001187de;
      iVar5 = UncachedRuneByteSuffix(this,bVar6,local_40[uVar7],false,iVar5);
    }
    uVar7 = uVar7 + 1;
  } while (uVar9 != uVar7);
LAB_0011886c:
  AddSuffix(this,iVar5);
  return;
}

Assistant:

void Compiler::AddRuneRangeUTF8(Rune lo, Rune hi, bool foldcase) {
  if (lo > hi)
    return;

  // Pick off 80-10FFFF as a common special case
  // that can bypass the slow rune_cache_.
  if (lo == 0x80 && hi == 0x10ffff && !reversed_) {
    Add_80_10ffff();
    return;
  }

  // Split range into same-length sized ranges.
  for (int i = 1; i < UTFmax; i++) {
    Rune max = MaxRune(i);
    if (lo <= max && max < hi) {
      AddRuneRangeUTF8(lo, max, foldcase);
      AddRuneRangeUTF8(max+1, hi, foldcase);
      return;
    }
  }

  // ASCII range is always a special case.
  if (hi < Runeself) {
    AddSuffix(UncachedRuneByteSuffix(static_cast<uint8>(lo),
                                     static_cast<uint8>(hi), foldcase, 0));
    return;
  }

  // Split range into sections that agree on leading bytes.
  for (int i = 1; i < UTFmax; i++) {
    uint m = (1<<(6*i)) - 1;  // last i bytes of a UTF-8 sequence
    if ((lo & ~m) != (hi & ~m)) {
      if ((lo & m) != 0) {
        AddRuneRangeUTF8(lo, lo|m, foldcase);
        AddRuneRangeUTF8((lo|m)+1, hi, foldcase);
        return;
      }
      if ((hi & m) != m) {
        AddRuneRangeUTF8(lo, (hi&~m)-1, foldcase);
        AddRuneRangeUTF8(hi&~m, hi, foldcase);
        return;
      }
    }
  }

  // Finally.  Generate byte matching equivalent for lo-hi.
  uint8 ulo[UTFmax], uhi[UTFmax];
  int n = runetochar(reinterpret_cast<char*>(ulo), &lo);
  int m = runetochar(reinterpret_cast<char*>(uhi), &hi);
  (void)m;  // USED(m)
  DCHECK_EQ(n, m);

  // The logic below encodes this thinking:
  //
  // 1. When we have built the whole suffix, we know that it cannot
  // possibly be a suffix of anything longer: in forward mode, nothing
  // else can occur before the leading byte; in reverse mode, nothing
  // else can occur after the last continuation byte or else the leading
  // byte would have to change. Thus, there is no benefit to caching
  // the first byte of the suffix whereas there is a cost involved in
  // cloning it if it begins a common prefix, which is fairly likely.
  //
  // 2. Conversely, the last byte of the suffix cannot possibly be a
  // prefix of anything because next == 0, so we will never want to
  // clone it, but it is fairly likely to be a common suffix. Perhaps
  // more so in reverse mode than in forward mode because the former is
  // "converging" towards lower entropy, but caching is still worthwhile
  // for the latter in cases such as 80-BF.
  //
  // 3. Handling the bytes between the first and the last is less
  // straightforward and, again, the approach depends on whether we are
  // "converging" towards lower entropy: in forward mode, a single byte
  // is unlikely to be part of a common suffix whereas a byte range
  // is more likely so; in reverse mode, a byte range is unlikely to
  // be part of a common suffix whereas a single byte is more likely
  // so. The same benefit versus cost argument applies here.
  int id = 0;
  if (reversed_) {
    for (int i = 0; i < n; i++) {
      // In reverse UTF-8 mode: cache the leading byte; don't cache the last
      // continuation byte; cache anything else iff it's a single byte (XX-XX).
      if (i == 0 || (ulo[i] == uhi[i] && i != n-1))
        id = CachedRuneByteSuffix(ulo[i], uhi[i], false, id);
      else
        id = UncachedRuneByteSuffix(ulo[i], uhi[i], false, id);
    }
  } else {
    for (int i = n-1; i >= 0; i--) {
      // In forward UTF-8 mode: don't cache the leading byte; cache the last
      // continuation byte; cache anything else iff it's a byte range (XX-YY).
      if (i == n-1 || (ulo[i] < uhi[i] && i != 0))
        id = CachedRuneByteSuffix(ulo[i], uhi[i], false, id);
      else
        id = UncachedRuneByteSuffix(ulo[i], uhi[i], false, id);
    }
  }
  AddSuffix(id);
}